

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# passphrase.c
# Opt level: O1

char * lafe_readpassphrase(char *prompt,char *buf,size_t bufsiz)

{
  bool bVar1;
  sig_atomic_t sVar2;
  int __fd;
  int iVar3;
  int iVar4;
  __pid_t __pid;
  long lVar5;
  size_t __n;
  long lVar6;
  int *piVar7;
  uint uVar8;
  char *pcVar9;
  char ch;
  termios term;
  termios oterm;
  sigaction sa;
  sigaction savepipe;
  sigaction savettou;
  sigaction savettin;
  sigaction savetstp;
  sigaction saveterm;
  sigaction savequit;
  sigaction savehup;
  sigaction saveint;
  sigaction savealrm;
  char local_6c5;
  int local_6c4;
  char *local_6c0;
  char *local_6b8;
  char *local_6b0;
  termios local_6a8;
  termios local_668;
  sigaction local_620;
  sigaction local_588;
  sigaction local_4f0;
  sigaction local_458;
  sigaction local_3c0;
  sigaction local_328;
  sigaction local_290;
  sigaction local_1f8;
  sigaction local_160;
  sigaction local_c8;
  
  local_6b8 = prompt;
  if (bufsiz == 0) {
    piVar7 = __errno_location();
    *piVar7 = 0x16;
    pcVar9 = (char *)0x0;
  }
  else {
    local_6b0 = buf + (bufsiz - 1);
    lVar5 = 0;
    local_6c0 = buf;
    do {
      do {
        signo[lVar5] = 0;
        lVar5 = lVar5 + 1;
      } while (lVar5 != 0x17);
      __fd = open("/dev/tty",2);
      iVar4 = __fd;
      if (__fd == -1) {
        __fd = 0;
        iVar4 = 2;
      }
      if ((__fd == 0) || (iVar3 = tcgetattr(__fd,&local_668), iVar3 != 0)) {
        local_6a8.c_iflag = 0;
        local_6a8.c_oflag = 0;
        local_6a8.c_cc[0x1f] = '\0';
        local_6a8._49_3_ = 0;
        local_6a8.c_ispeed = 0;
        local_6a8.c_ospeed = 0;
        local_6a8.c_cc[0xf] = '\0';
        local_6a8.c_cc[0x10] = '\0';
        local_6a8.c_cc[0x11] = '\0';
        local_6a8.c_cc[0x12] = '\0';
        local_6a8.c_cc[0x13] = '\0';
        local_6a8.c_cc[0x14] = '\0';
        local_6a8.c_cc[0x15] = '\0';
        local_6a8.c_cc[0x16] = '\0';
        local_6a8.c_cc[0x17] = '\0';
        local_6a8.c_cc[0x18] = '\0';
        local_6a8.c_cc[0x19] = '\0';
        local_6a8.c_cc[0x1a] = '\0';
        local_6a8.c_cc[0x1b] = '\0';
        local_6a8.c_cc[0x1c] = '\0';
        local_6a8.c_cc[0x1d] = '\0';
        local_6a8.c_cc[0x1e] = '\0';
        local_6a8.c_line = '\0';
        local_6a8.c_cc[0] = '\0';
        local_6a8.c_cc[1] = '\0';
        local_6a8.c_cc[2] = '\0';
        local_6a8.c_cc[3] = '\0';
        local_6a8.c_cc[4] = '\0';
        local_6a8.c_cc[5] = '\0';
        local_6a8.c_cc[6] = '\0';
        local_6a8.c_cc[7] = '\0';
        local_6a8.c_cc[8] = '\0';
        local_6a8.c_cc[9] = '\0';
        local_6a8.c_cc[10] = '\0';
        local_6a8.c_cc[0xb] = '\0';
        local_6a8.c_cc[0xc] = '\0';
        local_6a8.c_cc[0xd] = '\0';
        local_6a8.c_cc[0xe] = '\0';
        local_6a8.c_cflag = 0;
        local_6a8.c_lflag = 8;
        local_668.c_iflag = 0;
        local_668.c_oflag = 0;
        local_668.c_line = '\0';
        local_668.c_cc[0] = '\0';
        local_668.c_cc[1] = '\0';
        local_668.c_cc[2] = '\0';
        local_668.c_cc[3] = '\0';
        local_668.c_cc[4] = '\0';
        local_668.c_cc[5] = '\0';
        local_668.c_cc[6] = '\0';
        local_668.c_cc[7] = '\0';
        local_668.c_cc[8] = '\0';
        local_668.c_cc[9] = '\0';
        local_668.c_cc[10] = '\0';
        local_668.c_cc[0xb] = '\0';
        local_668.c_cc[0xc] = '\0';
        local_668.c_cc[0xd] = '\0';
        local_668.c_cc[0xe] = '\0';
        local_668.c_cc[0xf] = '\0';
        local_668.c_cc[0x10] = '\0';
        local_668.c_cc[0x11] = '\0';
        local_668.c_cc[0x12] = '\0';
        local_668.c_cc[0x13] = '\0';
        local_668.c_cc[0x14] = '\0';
        local_668.c_cc[0x15] = '\0';
        local_668.c_cc[0x16] = '\0';
        local_668.c_cc[0x17] = '\0';
        local_668.c_cc[0x18] = '\0';
        local_668.c_cc[0x19] = '\0';
        local_668.c_cc[0x1a] = '\0';
        local_668.c_cc[0x1b] = '\0';
        local_668.c_cc[0x1c] = '\0';
        local_668.c_cc[0x1d] = '\0';
        local_668.c_cc[0x1e] = '\0';
        local_668.c_cc[0x1f] = '\0';
        local_668._49_3_ = 0;
        local_668.c_ispeed = 0;
        local_668.c_ospeed = 0;
        local_668.c_cflag = 0;
        local_668.c_lflag = 8;
      }
      else {
        local_6a8.c_iflag = local_668.c_iflag;
        local_6a8.c_oflag = local_668.c_oflag;
        local_6a8.c_cc[0x1f] = local_668.c_cc[0x1f];
        local_6a8._49_3_ = local_668._49_3_;
        local_6a8.c_ispeed = local_668.c_ispeed;
        local_6a8.c_ospeed = local_668.c_ospeed;
        local_6a8.c_cc[0xf] = local_668.c_cc[0xf];
        local_6a8.c_cc[0x10] = local_668.c_cc[0x10];
        local_6a8.c_cc[0x11] = local_668.c_cc[0x11];
        local_6a8.c_cc[0x12] = local_668.c_cc[0x12];
        local_6a8.c_cc[0x13] = local_668.c_cc[0x13];
        local_6a8.c_cc[0x14] = local_668.c_cc[0x14];
        local_6a8.c_cc[0x15] = local_668.c_cc[0x15];
        local_6a8.c_cc[0x16] = local_668.c_cc[0x16];
        local_6a8.c_cc[0x17] = local_668.c_cc[0x17];
        local_6a8.c_cc[0x18] = local_668.c_cc[0x18];
        local_6a8.c_cc[0x19] = local_668.c_cc[0x19];
        local_6a8.c_cc[0x1a] = local_668.c_cc[0x1a];
        local_6a8.c_cc[0x1b] = local_668.c_cc[0x1b];
        local_6a8.c_cc[0x1c] = local_668.c_cc[0x1c];
        local_6a8.c_cc[0x1d] = local_668.c_cc[0x1d];
        local_6a8.c_cc[0x1e] = local_668.c_cc[0x1e];
        local_6a8.c_line = local_668.c_line;
        local_6a8.c_cc[0] = local_668.c_cc[0];
        local_6a8.c_cc[1] = local_668.c_cc[1];
        local_6a8.c_cc[2] = local_668.c_cc[2];
        local_6a8.c_cc[3] = local_668.c_cc[3];
        local_6a8.c_cc[4] = local_668.c_cc[4];
        local_6a8.c_cc[5] = local_668.c_cc[5];
        local_6a8.c_cc[6] = local_668.c_cc[6];
        local_6a8.c_cc[7] = local_668.c_cc[7];
        local_6a8.c_cc[8] = local_668.c_cc[8];
        local_6a8.c_cc[9] = local_668.c_cc[9];
        local_6a8.c_cc[10] = local_668.c_cc[10];
        local_6a8.c_cc[0xb] = local_668.c_cc[0xb];
        local_6a8.c_cc[0xc] = local_668.c_cc[0xc];
        local_6a8.c_cc[0xd] = local_668.c_cc[0xd];
        local_6a8.c_cc[0xe] = local_668.c_cc[0xe];
        local_6a8._8_8_ = local_668._8_8_ & 0xffffffb7ffffffff;
        tcsetattr(__fd,2,&local_6a8);
      }
      sigemptyset(&local_620.sa_mask);
      local_620.sa_flags = 0;
      local_620.__sigaction_handler.sa_handler = handler;
      sigaction(0xe,&local_620,&local_c8);
      sigaction(1,&local_620,&local_1f8);
      sigaction(2,&local_620,&local_160);
      sigaction(0xd,&local_620,&local_588);
      sigaction(3,&local_620,&local_290);
      sigaction(0xf,&local_620,&local_328);
      sigaction(0x14,&local_620,&local_3c0);
      sigaction(0x15,&local_620,&local_458);
      sigaction(0x16,&local_620,&local_4f0);
      pcVar9 = local_6b8;
      __n = strlen(local_6b8);
      write(iVar4,pcVar9,__n);
      lVar6 = read(__fd,&local_6c5,1);
      while (((lVar6 == 1 && (local_6c5 != '\n')) && (local_6c5 != '\r'))) {
        if (buf < local_6b0) {
          *buf = local_6c5;
          buf = buf + 1;
        }
        lVar6 = read(__fd,&local_6c5,1);
      }
      *buf = '\0';
      piVar7 = __errno_location();
      local_6c4 = *piVar7;
      if ((local_6a8._8_8_ & 0x800000000) == 0) {
        write(iVar4,"\n",1);
      }
      iVar4 = bcmp(&local_6a8,&local_668,0x3c);
      sVar2 = signo[0x16];
      if (iVar4 != 0) {
        do {
          iVar4 = tcsetattr(__fd,2,&local_668);
          if ((iVar4 != -1) || (*piVar7 != 4)) break;
        } while (signo[0x16] == 0);
      }
      signo[0x16] = sVar2;
      sigaction(0xe,&local_c8,(sigaction *)0x0);
      sigaction(1,&local_1f8,(sigaction *)0x0);
      sigaction(2,&local_160,(sigaction *)0x0);
      sigaction(3,&local_290,(sigaction *)0x0);
      sigaction(0xd,&local_588,(sigaction *)0x0);
      sigaction(0xf,&local_328,(sigaction *)0x0);
      sigaction(0x14,&local_3c0,(sigaction *)0x0);
      sigaction(0x15,&local_458,(sigaction *)0x0);
      sigaction(0x16,&local_4f0,(sigaction *)0x0);
      if (__fd != 0) {
        close(__fd);
      }
      lVar5 = 0;
      uVar8 = 0xffffffec;
      bVar1 = false;
      do {
        if (*(int *)((long)signo + lVar5) != 0) {
          __pid = getpid();
          kill(__pid,uVar8 + 0x14);
          if (uVar8 < 3) {
            bVar1 = true;
          }
        }
        lVar5 = lVar5 + 4;
        uVar8 = uVar8 + 1;
      } while (lVar5 != 0x5c);
      lVar5 = 0;
      buf = local_6c0;
    } while (bVar1);
    if (local_6c4 != 0) {
      *piVar7 = local_6c4;
    }
    pcVar9 = local_6c0;
    if (lVar6 == -1) {
      pcVar9 = (char *)0x0;
    }
  }
  if (pcVar9 == (char *)0x0) {
    piVar7 = __errno_location();
    if (*piVar7 != 4) {
      lafe_errc(1,*piVar7,"Couldn\'t read passphrase");
    }
  }
  return pcVar9;
}

Assistant:

static char *
readpassphrase(const char *prompt, char *buf, size_t bufsiz, int flags)
{
	ssize_t nr;
	int input, output, save_errno, i, need_restart;
	char ch, *p, *end;
	struct termios term, oterm;
#ifdef HAVE_SIGACTION
	struct sigaction sa, savealrm, saveint, savehup, savequit, saveterm;
	struct sigaction savetstp, savettin, savettou, savepipe;
#endif

	/* I suppose we could alloc on demand in this case (XXX). */
	if (bufsiz == 0) {
		errno = EINVAL;
		return(NULL);
	}

restart:
	for (i = 0; i <= MAX_SIGNO; i++)
		signo[i] = 0;
	nr = -1;
	save_errno = 0;
	need_restart = 0;
	/*
	 * Read and write to /dev/tty if available.  If not, read from
	 * stdin and write to stderr unless a tty is required.
	 */
	if ((flags & RPP_STDIN) ||
	    (input = output = open(_PATH_TTY, O_RDWR)) == -1) {
		if (flags & RPP_REQUIRE_TTY) {
			errno = ENOTTY;
			return(NULL);
		}
		input = STDIN_FILENO;
		output = STDERR_FILENO;
	}

	/*
	 * Turn off echo if possible.
	 * If we are using a tty but are not the foreground pgrp this will
	 * generate SIGTTOU, so do it *before* installing the signal handlers.
	 */
	if (input != STDIN_FILENO && tcgetattr(input, &oterm) == 0) {
		memcpy(&term, &oterm, sizeof(term));
		if (!(flags & RPP_ECHO_ON))
			term.c_lflag &= ~(ECHO | ECHONL);
#ifdef VSTATUS
		if (term.c_cc[VSTATUS] != _POSIX_VDISABLE)
			term.c_cc[VSTATUS] = _POSIX_VDISABLE;
#endif
		(void)tcsetattr(input, _T_FLUSH, &term);
	} else {
		memset(&term, 0, sizeof(term));
		term.c_lflag |= ECHO;
		memset(&oterm, 0, sizeof(oterm));
		oterm.c_lflag |= ECHO;
	}

#ifdef HAVE_SIGACTION
	/*
	 * Catch signals that would otherwise cause the user to end
	 * up with echo turned off in the shell.  Don't worry about
	 * things like SIGXCPU and SIGVTALRM for now.
	 */
	sigemptyset(&sa.sa_mask);
	sa.sa_flags = 0;		/* don't restart system calls */
	sa.sa_handler = handler;
	/* Keep this list in sync with MAX_SIGNO! */
	(void)sigaction(SIGALRM, &sa, &savealrm);
	(void)sigaction(SIGHUP, &sa, &savehup);
	(void)sigaction(SIGINT, &sa, &saveint);
	(void)sigaction(SIGPIPE, &sa, &savepipe);
	(void)sigaction(SIGQUIT, &sa, &savequit);
	(void)sigaction(SIGTERM, &sa, &saveterm);
	(void)sigaction(SIGTSTP, &sa, &savetstp);
	(void)sigaction(SIGTTIN, &sa, &savettin);
	(void)sigaction(SIGTTOU, &sa, &savettou);
#endif

	if (!(flags & RPP_STDIN)) {
		int r = write(output, prompt, strlen(prompt));
		(void)r;
	}
	end = buf + bufsiz - 1;
	p = buf;
	while ((nr = read(input, &ch, 1)) == 1 && ch != '\n' && ch != '\r') {
		if (p < end) {
			if ((flags & RPP_SEVENBIT))
				ch &= 0x7f;
			if (isalpha((unsigned char)ch)) {
				if ((flags & RPP_FORCELOWER))
					ch = (char)tolower((unsigned char)ch);
				if ((flags & RPP_FORCEUPPER))
					ch = (char)toupper((unsigned char)ch);
			}
			*p++ = ch;
		}
	}
	*p = '\0';
	save_errno = errno;
	if (!(term.c_lflag & ECHO)) {
		int r = write(output, "\n", 1);
		(void)r;
	}

	/* Restore old terminal settings and signals. */
	if (memcmp(&term, &oterm, sizeof(term)) != 0) {
		const int sigttou = signo[SIGTTOU];

		/* Ignore SIGTTOU generated when we are not the fg pgrp. */
		while (tcsetattr(input, _T_FLUSH, &oterm) == -1 &&
		    errno == EINTR && !signo[SIGTTOU])
			continue;
		signo[SIGTTOU] = sigttou;
	}
#ifdef HAVE_SIGACTION
	(void)sigaction(SIGALRM, &savealrm, NULL);
	(void)sigaction(SIGHUP, &savehup, NULL);
	(void)sigaction(SIGINT, &saveint, NULL);
	(void)sigaction(SIGQUIT, &savequit, NULL);
	(void)sigaction(SIGPIPE, &savepipe, NULL);
	(void)sigaction(SIGTERM, &saveterm, NULL);
	(void)sigaction(SIGTSTP, &savetstp, NULL);
	(void)sigaction(SIGTTIN, &savettin, NULL);
	(void)sigaction(SIGTTOU, &savettou, NULL);
#endif
	if (input != STDIN_FILENO)
		(void)close(input);

	/*
	 * If we were interrupted by a signal, resend it to ourselves
	 * now that we have restored the signal handlers.
	 */
	for (i = 0; i <= MAX_SIGNO; i++) {
		if (signo[i]) {
			kill(getpid(), i);
			switch (i) {
			case SIGTSTP:
			case SIGTTIN:
			case SIGTTOU:
				need_restart = 1;
			}
		}
	}
	if (need_restart)
		goto restart;

	if (save_errno)
		errno = save_errno;
	return(nr == -1 ? NULL : buf);
}